

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadMesh(ColladaParser *this,Mesh *pMesh)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  string local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar2;
    while (cVar1 != '\0') {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
LAB_003f80d2:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"source");
        if (iVar2 == 0) {
          ReadSource(this);
        }
        else {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_003f80d2;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"vertices");
          if (iVar2 == 0) {
            ReadVertexData(this,pMesh);
          }
          else {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_003f80d2;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"triangles");
            if (iVar2 != 0) {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar2 != 1) goto LAB_003f80d2;
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"lines");
              if (iVar2 != 0) {
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar2 != 1) goto LAB_003f80d2;
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"linestrips");
                if (iVar2 != 0) {
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar2 != 1) goto LAB_003f80d2;
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar2 = strcmp((char *)CONCAT44(extraout_var_04,iVar2),"polygons");
                  if (iVar2 != 0) {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar2 != 1) goto LAB_003f80d2;
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar2 = strcmp((char *)CONCAT44(extraout_var_05,iVar2),"polylist");
                    if (iVar2 != 0) {
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar2 != 1) goto LAB_003f80d2;
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar2 = strcmp((char *)CONCAT44(extraout_var_06,iVar2),"trifans");
                      if (iVar2 != 0) {
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar2 != 1) goto LAB_003f80d2;
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar2 = strcmp((char *)CONCAT44(extraout_var_07,iVar2),"tristrips");
                        if (iVar2 != 0) {
                          SkipElement(this);
                          goto LAB_003f8092;
                        }
                      }
                    }
                  }
                }
              }
            }
            ReadIndexData(this,pMesh);
          }
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_08,iVar2),"technique_common");
        if (iVar2 != 0) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_09,iVar2),"mesh");
          if (iVar2 == 0) {
            return;
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Expected end of <mesh> element.","");
          ThrowException(this,&local_50);
        }
      }
LAB_003f8092:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      cVar1 = (char)iVar2;
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadMesh(Mesh* pMesh)
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("source"))
            {
                // we have professionals dealing with this
                ReadSource();
            }
            else if (IsElement("vertices"))
            {
                // read per-vertex mesh data
                ReadVertexData(pMesh);
            }
            else if (IsElement("triangles") || IsElement("lines") || IsElement("linestrips")
                || IsElement("polygons") || IsElement("polylist") || IsElement("trifans") || IsElement("tristrips"))
            {
                // read per-index mesh data and faces setup
                ReadIndexData(pMesh);
            }
            else
            {
                // ignore the restf
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else if (strcmp(mReader->getNodeName(), "mesh") == 0)
            {
                // end of <mesh> element - we're done here
                break;
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <mesh> element.");
            }
        }
    }
}